

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,ConstPixelBufferAccess *access,
          qpImageCompressionMode compression)

{
  ConstPixelBufferAccess *baseAccess;
  ChannelOrder CVar1;
  pointer pcVar2;
  bool bVar3;
  int i;
  long lVar4;
  ConstPixelBufferAccess depthAccess;
  Vec4 stencilBias;
  Vec4 stencilScale;
  Vec4 depthBias;
  Vec4 depthScale;
  ConstPixelBufferAccess stencilAccess;
  ConstPixelBufferAccess local_c0;
  Vec4 local_98;
  Vec4 local_88;
  Vec4 local_78;
  Vec4 local_68;
  ConstPixelBufferAccess local_58;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + name->_M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  pcVar2 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar2,pcVar2 + description->_M_string_length);
  baseAccess = &this->m_access;
  (this->m_access).m_format = access->m_format;
  lVar4 = 0;
  do {
    (this->m_access).m_size.m_data[lVar4] = (access->m_size).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    (this->m_access).m_pitch.m_data[lVar4] = (access->m_pitch).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  (this->m_access).m_data = access->m_data;
  *(undefined1 **)(this->m_scale).m_data = &DAT_3f8000003f800000;
  *(undefined1 **)((this->m_scale).m_data + 2) = &DAT_3f8000003f800000;
  (this->m_bias).m_data[0] = 0.0;
  (this->m_bias).m_data[1] = 0.0;
  (this->m_bias).m_data[2] = 0.0;
  (this->m_bias).m_data[3] = 0.0;
  this->m_compression = compression;
  bVar3 = isCombinedDepthStencilType((this->m_access).m_format.type);
  if (bVar3) {
    CVar1 = (baseAccess->m_format).order;
    if (CVar1 == S) {
      getEffectiveDepthStencilAccess(&local_c0,baseAccess,MODE_STENCIL);
    }
    else {
      if (CVar1 != D) goto LAB_005e531d;
      getEffectiveDepthStencilAccess(&local_c0,baseAccess,MODE_DEPTH);
    }
    (this->m_access).m_data = local_c0.m_data;
    *(undefined8 *)((this->m_access).m_size.m_data + 2) = local_c0._16_8_;
    *(undefined8 *)((this->m_access).m_pitch.m_data + 1) = local_c0.m_pitch.m_data._4_8_;
    baseAccess->m_format = local_c0.m_format;
    *(undefined8 *)(this->m_access).m_size.m_data = local_c0.m_size.m_data._0_8_;
  }
LAB_005e531d:
  if ((baseAccess->m_format).order == DS) {
    getEffectiveDepthStencilAccess(&local_c0,baseAccess,MODE_DEPTH);
    getEffectiveDepthStencilAccess(&local_58,baseAccess,MODE_STENCIL);
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.0;
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 0.0;
    local_78.m_data[3] = 0.0;
    local_88.m_data[0] = 0.0;
    local_88.m_data[1] = 0.0;
    local_88.m_data[2] = 0.0;
    local_88.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    computePixelScaleBias(&local_c0,&local_68,&local_78);
    computePixelScaleBias(&local_58,&local_88,&local_98);
    (this->m_scale).m_data[0] = local_68.m_data[0];
    (this->m_scale).m_data[1] = local_88.m_data[0];
    (this->m_scale).m_data[2] = 0.0;
    (this->m_scale).m_data[3] = 0.0;
    (this->m_bias).m_data[0] = local_78.m_data[0];
    (this->m_bias).m_data[1] = local_98.m_data[0];
    (this->m_bias).m_data[2] = 0.0;
    (this->m_bias).m_data[3] = 0.0;
  }
  else {
    computePixelScaleBias(baseAccess,&this->m_scale,&this->m_bias);
  }
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const ConstPixelBufferAccess& access, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(access)
	, m_scale		(1.0f, 1.0f, 1.0f, 1.0f)
	, m_bias		(0.0f, 0.0f, 0.0f, 0.0f)
	, m_compression	(compression)
{
	// Simplify combined formats that only use a single channel
	if (tcu::isCombinedDepthStencilType(m_access.getFormat().type))
	{
		if (m_access.getFormat().order == tcu::TextureFormat::D)
			m_access = tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		else if (m_access.getFormat().order == tcu::TextureFormat::S)
			m_access = tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);
	}

	// Implicit scale and bias
	if (m_access.getFormat().order != tcu::TextureFormat::DS)
		computePixelScaleBias(m_access, m_scale, m_bias);
	else
	{
		// Pack D and S bias and scale to R and G
		const ConstPixelBufferAccess	depthAccess		= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	stencilAccess	= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);
		tcu::Vec4						depthScale;
		tcu::Vec4						depthBias;
		tcu::Vec4						stencilScale;
		tcu::Vec4						stencilBias;

		computePixelScaleBias(depthAccess, depthScale, depthBias);
		computePixelScaleBias(stencilAccess, stencilScale, stencilBias);

		m_scale = tcu::Vec4(depthScale.x(), stencilScale.x(), 0.0f, 0.0f);
		m_bias = tcu::Vec4(depthBias.x(), stencilBias.x(), 0.0f, 0.0f);
	}
}